

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GLMClassifier::Clear(GLMClassifier *this)

{
  uint32_t cached_has_bits;
  GLMClassifier *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::Clear
            (&this->weights_);
  google::protobuf::RepeatedField<double>::Clear(&this->offset_);
  memset(&this->postevaluationtransform_,0,8);
  clear_ClassLabels(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void GLMClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GLMClassifier)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  weights_.Clear();
  offset_.Clear();
  ::memset(&postevaluationtransform_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&classencoding_) -
      reinterpret_cast<char*>(&postevaluationtransform_)) + sizeof(classencoding_));
  clear_ClassLabels();
  _internal_metadata_.Clear<std::string>();
}